

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

uint32_t run_container_rank_many
                   (run_container_t *container,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint32_t *iter;
  int iVar7;
  int iVar8;
  uint64_t uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  
  puVar6 = begin;
  if (begin != end) {
    uVar3 = *begin;
    iVar11 = 0;
    iVar7 = 0;
    puVar5 = begin;
    do {
      puVar6 = puVar5;
      if (0xffff < (*puVar5 ^ uVar3)) break;
      iVar8 = container->n_runs;
      if (iVar7 < iVar8) {
        uVar12 = *puVar5 & 0xffff;
        lVar10 = (long)iVar7;
        lVar13 = 0;
        do {
          uVar1 = container->runs[lVar10 + lVar13].value;
          uVar2 = container->runs[lVar10 + lVar13].length;
          if (uVar12 <= (uint)uVar2 + (uint)uVar1) {
            uVar9 = (long)iVar11 + start_rank;
            if (uVar1 <= uVar12) {
              uVar9 = (ulong)(uVar12 - uVar1) + start_rank + 1 + (long)iVar11;
            }
            iVar7 = iVar7 + (int)lVar13;
            *ans = uVar9;
            ans = ans + 1;
            goto LAB_0011e16d;
          }
          iVar11 = iVar11 + (uint)uVar2 + 1;
          lVar13 = lVar13 + 1;
        } while (iVar8 - lVar10 != lVar13);
LAB_0011e171:
        *ans = (long)iVar11 + start_rank;
        ans = ans + 1;
        iVar7 = iVar8;
      }
      else {
LAB_0011e16d:
        bVar4 = iVar8 <= iVar7;
        iVar8 = iVar7;
        if (bVar4) goto LAB_0011e171;
      }
      puVar5 = puVar5 + 1;
      puVar6 = end;
    } while (puVar5 != end);
  }
  return (uint32_t)((ulong)((long)puVar6 - (long)begin) >> 2);
}

Assistant:

uint32_t run_container_rank_many(const run_container_t *container,
                                 uint64_t start_rank, const uint32_t *begin,
                                 const uint32_t *end, uint64_t *ans) {
    const uint16_t high = (uint16_t)((*begin) >> 16);
    const uint32_t *iter = begin;
    int sum = 0;
    int i = 0;
    for (; iter != end; iter++) {
        uint32_t x = *iter;
        uint16_t xhigh = (uint16_t)(x >> 16);
        if (xhigh != high) return iter - begin;  // stop at next container

        uint32_t x32 = x & 0xFFFF;
        while (i < container->n_runs) {
            uint32_t startpoint = container->runs[i].value;
            uint32_t length = container->runs[i].length;
            uint32_t endpoint = length + startpoint;
            if (x32 <= endpoint) {
                if (x32 < startpoint) {
                    *(ans++) = start_rank + sum;
                } else {
                    *(ans++) = start_rank + sum + (x32 - startpoint) + 1;
                }
                break;
            } else {
                sum += length + 1;
                i++;
            }
        }
        if (i >= container->n_runs) *(ans++) = start_rank + sum;
    }

    return iter - begin;
}